

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O3

bool __thiscall
iutest::detail::iuCartesianProductGenerator<bool,_int,_int>::IsEnd
          (iuCartesianProductGenerator<bool,_int,_int> *this)

{
  int iVar1;
  
  iVar1 = (*((this->v).
             super__Tuple_impl<0UL,_iutest::detail::iuParamGenerator<bool>,_iutest::detail::iuParamGenerator<int>,_iutest::detail::iuParamGenerator<int>_>
             .super__Head_base<0UL,_iutest::detail::iuParamGenerator<bool>,_false>._M_head_impl.
            m_pInterface)->_vptr_iuIParamGenerator[5])();
  if ((char)iVar1 != '\0') {
    iVar1 = (*((this->v).
               super__Tuple_impl<0UL,_iutest::detail::iuParamGenerator<bool>,_iutest::detail::iuParamGenerator<int>,_iutest::detail::iuParamGenerator<int>_>
               .
               super__Tuple_impl<1UL,_iutest::detail::iuParamGenerator<int>,_iutest::detail::iuParamGenerator<int>_>
               .super__Head_base<1UL,_iutest::detail::iuParamGenerator<int>,_false>._M_head_impl.
              m_pInterface)->_vptr_iuIParamGenerator[5])();
    if ((char)iVar1 != '\0') {
      iVar1 = (*((this->v).
                 super__Tuple_impl<0UL,_iutest::detail::iuParamGenerator<bool>,_iutest::detail::iuParamGenerator<int>,_iutest::detail::iuParamGenerator<int>_>
                 .
                 super__Tuple_impl<1UL,_iutest::detail::iuParamGenerator<int>,_iutest::detail::iuParamGenerator<int>_>
                 .super__Tuple_impl<2UL,_iutest::detail::iuParamGenerator<int>_>.
                 super__Head_base<2UL,_iutest::detail::iuParamGenerator<int>,_false>._M_head_impl.
                m_pInterface)->_vptr_iuIParamGenerator[5])();
      return SUB41(iVar1,0);
    }
  }
  return false;
}

Assistant:

virtual bool IsEnd() const IUTEST_CXX_OVERRIDE
    {
        return is_end_foreach<0, kCount>(v);
    }